

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Limiter.h
# Opt level: O0

Code __thiscall Limiter::ValidateRequest(Limiter *this)

{
  int iVar1;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> l;
  Limiter *this_local;
  
  l._M_device = &this->mutex_;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->mutex_);
  iVar1 = HitQueue::ActiveSum(&this->hitQueue_);
  if (iVar1 < this->maxRPS_) {
    HitQueue::AddHit(&this->hitQueue_);
    this_local._4_4_ = Ok;
  }
  else {
    this_local._4_4_ = TooManyRequests;
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return this_local._4_4_;
}

Assistant:

HttpResult::Code ValidateRequest()
    {
        std::lock_guard<std::mutex> l(mutex_);
        if (hitQueue_.ActiveSum() >= maxRPS_)
        {
            return HttpResult::Code::TooManyRequests;
        }
        hitQueue_.AddHit();
        return HttpResult::Code::Ok;
    }